

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O1

void __thiscall fp::Algorithm::DFSAlgorithm(Algorithm *this,shared_ptr<fp::LandBasedRobot> *robot)

{
  array<int,_2UL> aVar1;
  array<int,_2UL> aVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ostream *this_00;
  long *plVar7;
  long lVar8;
  _Elt_pointer paVar9;
  char *pcVar10;
  array<int,_2UL> curr_node;
  array<int,_2UL> next_node;
  array<int,_2UL> local_40;
  array<int,_2UL> local_38;
  
  (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  iVar3 = (**((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_LandBasedRobot)();
  iVar4 = (*((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_LandBasedRobot[0x15])();
  local_40._M_elems[0] = iVar4;
  iVar5 = (*((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_LandBasedRobot[0x16])();
  local_40._M_elems[1] = iVar5;
  local_38._M_elems[0] = 0;
  local_38._M_elems[1] = 0;
  *&(this->node_master_)._M_elems[iVar4]._M_elems[iVar5].parent_node_._M_elems = local_40._M_elems;
  SetDefaults(this);
  aVar2._M_elems = local_40._M_elems;
  do {
    local_40._M_elems = aVar2._M_elems;
    aVar2._M_elems = local_40._M_elems;
    Maze::ReadMaze(&this->maze_info,local_40,(char)iVar3);
    FindNeighbours(this,aVar2,(char)iVar3);
    lVar6 = (long)local_40._M_elems[0];
    lVar8 = (long)local_40._M_elems[1];
    paVar9 = (this->node_master_)._M_elems[lVar6]._M_elems[lVar8].child_node_.c.
             super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur;
    if (paVar9 == (this->node_master_)._M_elems[lVar6]._M_elems[lVar8].child_node_.c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_38._M_elems =
           *&(this->node_master_)._M_elems[lVar6]._M_elems[lVar8].parent_node_._M_elems;
      lVar6 = 0x15;
      pcVar10 = "Next is Parent Node: ";
    }
    else {
      if (paVar9 == (this->node_master_)._M_elems[lVar6]._M_elems[lVar8].child_node_.c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        paVar9 = (this->node_master_)._M_elems[lVar6]._M_elems[lVar8].child_node_.c.
                 super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_38._M_elems = *&paVar9[-1]._M_elems;
      std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::pop_back
                (&(this->node_master_)._M_elems[lVar6]._M_elems[lVar8].child_node_.c);
      lVar6 = 0xc;
      pcVar10 = "Child Node: ";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,lVar6);
    this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_38._M_elems[0]);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    plVar7 = (long *)std::ostream::operator<<(this_00,local_38._M_elems[1]);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    Navigate(this,&local_40,&local_38);
    iVar3 = (**((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_LandBasedRobot)();
    aVar1._M_elems = local_38._M_elems;
    aVar2._M_elems[0] = local_38._M_elems[0];
    aVar2._M_elems[1] = local_38._M_elems[1];
    local_40._M_elems[0] = local_38._M_elems[0];
    local_40._M_elems[1] = local_38._M_elems[1];
  } while ((((local_38._M_elems != *&(this->goal1_)._M_elems) &&
            (local_38._M_elems != *&(this->goal2_)._M_elems)) &&
           (local_38._M_elems != *&(this->goal3_)._M_elems)) &&
          (local_38._M_elems != *&(this->goal4_)._M_elems));
  SetDefaults(this);
  *&(this->end_goal_)._M_elems = aVar1._M_elems;
  API::setColor(local_40._M_elems[1],0xf - local_40._M_elems[0],'r');
  return;
}

Assistant:

void fp::Algorithm::DFSAlgorithm(const std::shared_ptr<fp::LandBasedRobot> &robot) {
    this->robot_ = robot;
    char curr_direction{robot->GetDirection()};
    std::array<int, 2> curr_node{robot->get_x_(), robot->get_y_()};
    std::array<int, 2> next_node{};
    this->node_master_[curr_node[0]][curr_node[1]].parent_node_ = curr_node;

    //---> Step 01: Clear all tile color <---//
    SetDefaults();
    while (true) {
        //---> Step 02: Read walls around the robot <---//
        this->maze_info.ReadMaze(curr_node, curr_direction);
        FindNeighbours(curr_node, curr_direction);
        if (!this->node_master_[curr_node[0]][curr_node[1]].child_node_.empty()) {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].child_node_.top();
            this->node_master_[curr_node[0]][curr_node[1]].child_node_.pop();
            std::cerr << "Child Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        } else {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].parent_node_;
            std::cerr << "Next is Parent Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        }
        this->Navigate(curr_node, next_node);


        //---> Step 06: Get robot current cell info <---//
        curr_direction = this->robot_->GetDirection();
        curr_node = next_node;

        //---> Step 07: Check for goal <---//
        if (curr_node == this->goal1_ || curr_node == this->goal2_ ||
            curr_node == this->goal3_ || curr_node == this->goal4_) {
            SetDefaults();
            this->end_goal_ = curr_node;
            fp::API::setColor(curr_node[1], 15 - curr_node[0], 'r');
            return;
        }
    }
    std::cerr << "\nNo path found!\n" << std::endl;
}